

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyScriptPubKeyMan::ImportPubKeys
          (LegacyScriptPubKeyMan *this,
          vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>
          *ordered_pubkeys,
          map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          *pubkey_map,
          map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
          *key_origins,bool add_keypool,int64_t timestamp)

{
  long lVar1;
  pointer ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  _Rep_type *p_Var3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  _Base_ptr p_Var7;
  const_iterator cVar8;
  mapped_type *pmVar9;
  size_t sVar10;
  undefined3 in_register_00000081;
  undefined4 uVar11;
  pointer __k;
  CPubKey *pubKey;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  undefined1 in_stack_fffffffffffffef8 [12];
  WalletBatch local_d0;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_c0;
  string local_a0;
  CPubKey temp;
  WalletDatabase *pWVar6;
  
  uVar11 = CONCAT31(in_register_00000081,add_keypool);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar6 = (WalletDatabase *)CONCAT44(extraout_var,iVar5);
  (*pWVar6->_vptr_WalletDatabase[0xe])(&local_d0,pWVar6,1);
  local_d0.m_database = pWVar6;
  for (p_Var7 = (key_origins->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &(key_origins->_M_t)._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7)) {
    AddKeyOriginWithDB(this,&local_d0,(CPubKey *)&p_Var7[1]._M_right,(KeyOriginInfo *)(p_Var7 + 4));
  }
  ppVar2 = (ordered_pubkeys->
           super__Vector_base<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  p_Var3 = (_Rep_type *)&(pubkey_map->_M_t)._M_impl;
  for (__k = (ordered_pubkeys->
             super__Vector_base<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>)
             ._M_impl.super__Vector_impl_data._M_start; __k != ppVar2; __k = __k + 1) {
    cVar8 = std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
            ::find(&pubkey_map->_M_t,&__k->first);
    if ((_Rb_tree_header *)cVar8._M_node != &(p_Var3->_M_impl).super__Rb_tree_header) {
      temp.vch[0] = 0xff;
      iVar5 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1f])
                        (this,__k,&temp);
      if ((char)iVar5 == '\0') {
        pubKey = (CPubKey *)((long)&cVar8._M_node[1]._M_left + 4);
        GetScriptForRawPubKey((CScript *)&local_c0,pubKey);
        bVar4 = AddWatchOnlyWithDB(this,&local_d0,(CScript *)&local_c0,timestamp);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_c0);
        if (!bVar4) break;
        pmVar9 = std::
                 map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                 ::operator[](&(this->super_LegacyDataSPKM).mapKeyMetadata,&__k->first);
        pmVar9->nCreateTime = timestamp;
        if ((char)uVar11 != '\0') {
          AddKeypoolPubkeyWithDB(this,pubKey,__k->second,&local_d0);
          boost::signals2::
          signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
          ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.
                        NotifyCanGetAddressesChanged);
        }
      }
      else {
        sVar10 = 0x21;
        if ((temp.vch[0] & 0xfe) != 2) {
          if ((byte)(temp.vch[0] - 4) < 4) {
            sVar10 = *(size_t *)(&DAT_00b70b20 + (ulong)(byte)(temp.vch[0] - 4) * 8);
          }
          else {
            sVar10 = 0;
          }
        }
        s.m_size = sVar10;
        s.m_data = temp.vch;
        HexStr_abi_cxx11_(&local_a0,s);
        parameters._M_string_length._4_4_ = uVar11;
        parameters._0_12_ = in_stack_fffffffffffffef8;
        parameters.field_2._M_allocated_capacity = timestamp;
        parameters.field_2._8_8_ = pubkey_map;
        ScriptPubKeyMan::WalletLogPrintf<std::__cxx11::string>
                  ((ScriptPubKeyMan *)this,"Already have pubkey %s, skipping\n",parameters);
        std::__cxx11::string::~string((string *)&local_a0);
      }
    }
  }
  if (local_d0.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (*(*(_func_int ***)
        local_d0.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __k == ppVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::ImportPubKeys(const std::vector<std::pair<CKeyID, bool>>& ordered_pubkeys, const std::map<CKeyID, CPubKey>& pubkey_map, const std::map<CKeyID, std::pair<CPubKey, KeyOriginInfo>>& key_origins, const bool add_keypool, const int64_t timestamp)
{
    WalletBatch batch(m_storage.GetDatabase());
    for (const auto& entry : key_origins) {
        AddKeyOriginWithDB(batch, entry.second.first, entry.second.second);
    }
    for (const auto& [id, internal] : ordered_pubkeys) {
        auto entry = pubkey_map.find(id);
        if (entry == pubkey_map.end()) {
            continue;
        }
        const CPubKey& pubkey = entry->second;
        CPubKey temp;
        if (GetPubKey(id, temp)) {
            // Already have pubkey, skipping
            WalletLogPrintf("Already have pubkey %s, skipping\n", HexStr(temp));
            continue;
        }
        if (!AddWatchOnlyWithDB(batch, GetScriptForRawPubKey(pubkey), timestamp)) {
            return false;
        }
        mapKeyMetadata[id].nCreateTime = timestamp;

        // Add to keypool only works with pubkeys
        if (add_keypool) {
            AddKeypoolPubkeyWithDB(pubkey, internal, batch);
            NotifyCanGetAddressesChanged();
        }
    }
    return true;
}